

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::AddLayer
          (ChElementShellANCF_3443 *this,double thickness,double theta,
          shared_ptr<chrono::fea::ChMaterialShellANCF> *material)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  iterator __position;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  shared_ptr<chrono::fea::ChMaterialShellANCF> local_48;
  double local_30;
  Layer local_28;
  
  local_48.super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_48.super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (material->super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  p_Var1 = (material->
           super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_30 = thickness;
  Layer::Layer(&local_28,thickness,theta,&local_48);
  std::
  vector<chrono::fea::ChElementShellANCF_3443::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3443::Layer>_>
  ::emplace_back<chrono::fea::ChElementShellANCF_3443::Layer>(&this->m_layers,&local_28);
  if (local_28.m_material.
      super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.m_material.
               super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_48.super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  __position._M_current =
       (this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,Eigen::aligned_allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,Eigen::aligned_allocator<double>> *)&this->m_layer_zoffsets,__position
               ,&this->m_thicknessZ);
    dVar5 = this->m_thicknessZ;
  }
  else {
    dVar5 = this->m_thicknessZ;
    *__position._M_current = dVar5;
    (this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  this->m_numLayers = this->m_numLayers + 1;
  this->m_thicknessZ = dVar5 + local_30;
  lVar2 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols * (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
  lVar3 = (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  lVar4 = lVar3 + lVar2;
  if (lVar4 != 0 && SCARRY8(lVar3,lVar2) == lVar4 < 0) {
    PrecomputeInternalForceMatricesWeights(this);
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::AddLayer(double thickness, double theta, std::shared_ptr<ChMaterialShellANCF> material) {
    m_layers.push_back(Layer(thickness, theta, material));
    m_layer_zoffsets.push_back(m_thicknessZ);
    m_numLayers += 1;
    m_thicknessZ += thickness;

    // Check to see if SetupInitial has already been called (i.e. at least one set of precomputed matrices has been
    // populated).  If so, the precomputed matrices will need to be re-generated.  If not, this will be handled once
    // SetupInitial is called.
    if (m_SD.size() + m_O1.size() > 0) {
        PrecomputeInternalForceMatricesWeights();
    }
}